

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<prometheus::(anonymous_namespace)::IntegrationTest_unexposeRegistry_Test>::
CreateTest(TestFactoryImpl<prometheus::(anonymous_namespace)::IntegrationTest_unexposeRegistry_Test>
           *this)

{
  Test *this_00;
  TestFactoryImpl<prometheus::(anonymous_namespace)::IntegrationTest_unexposeRegistry_Test>
  *this_local;
  
  this_00 = (Test *)operator_new(0x78);
  prometheus::anon_unknown_0::IntegrationTest_unexposeRegistry_Test::
  IntegrationTest_unexposeRegistry_Test((IntegrationTest_unexposeRegistry_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }